

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::clear(SPxSolverBase<double> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  
  std::vector<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>::
  resize(&(this->unitVecs).data,0);
  pdVar1 = (this->dualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->dualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->dualVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->dualVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  SSVectorBase<double>::clear(&(this->dualVec).thedelta);
  (this->dualVec).theval = 0.0;
  pdVar1 = (this->primRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->primRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->primVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->primVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  SSVectorBase<double>::clear(&(this->primVec).thedelta);
  (this->primVec).theval = 0.0;
  pdVar1 = (this->addVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->addVec).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  SSVectorBase<double>::clear(&(this->addVec).thedelta);
  (this->addVec).theval = 0.0;
  pdVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  pdVar1 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    memset(pdVar1,0,(long)pdVar2 - (long)pdVar1 & 0xfffffffffffffff8);
  }
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  LPRowSetBase<double>::clear((LPRowSetBase<double> *)this);
  LPColSetBase<double>::clear(&(this->super_SPxLPBase<double>).super_LPColSetBase<double>);
  (this->super_SPxLPBase<double>).thesense = MAXIMIZE;
  (this->super_SPxLPBase<double>).offset = 0.0;
  (this->super_SPxLPBase<double>)._isScaled = false;
  (this->super_SPxLPBase<double>).lp_scaler = (SPxScaler<double> *)0x0;
  (this->super_SPxLPBase<double>).super_LPColSetBase<double>.scaleExp.thesize = 0;
  (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.scaleExp.thesize = 0;
  if (this->m_status == OPTIMAL) {
    this->m_status = UNKNOWN;
  }
  if ((this->super_SPxBasisBase<double>).thestatus != NO_PROBLEM) {
    (this->super_SPxBasisBase<double>).thestatus = NO_PROBLEM;
    SPxBasisBase<double>::invalidate(&this->super_SPxBasisBase<double>);
  }
  if ((this->super_SPxBasisBase<double>).theLP != (SPxSolverBase<double> *)0x0) {
    SPxBasisBase<double>::reDim(&this->super_SPxBasisBase<double>);
  }
  (this->infeasibilities).super_IdxSet.num = 0;
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  (this->isInfeasible).thesize = 0;
  (this->isInfeasibleCo).thesize = 0;
  return;
}

Assistant:

void SPxSolverBase<R>::clear()
   {
      unitVecs.reSize(0);

      dualRhs.clear();
      dualVec.clear();
      primRhs.clear();
      primVec.clear();
      addVec.clear();
      theURbound.clear();
      theLRbound.clear();
      theUCbound.clear();
      theLCbound.clear();
      theTest.clear();
      theCoTest.clear();

      forceRecompNonbasicValue();
      unInit();
      SPxLPBase<R>::clear();
      setBasisStatus(SPxBasisBase<R>::NO_PROBLEM);

      // clear the basis only when theLP is present, because LP data (nrows, ncols) is used in reDim()
      if(this->theLP != nullptr)
         SPxBasisBase<R>::reDim();

      infeasibilities.clear();
      infeasibilitiesCo.clear();
      isInfeasible.clear();
      isInfeasibleCo.clear();
   }